

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall perfetto::TracingSession::FlushBlocking(TracingSession *this,uint32_t timeout_ms)

{
  atomic<bool> flush_result;
  WaitableEvent flush_ack;
  byte local_99;
  WaitableEvent *local_98;
  byte *pbStack_90;
  code *local_88;
  code *pcStack_80;
  WaitableEvent local_78;
  
  base::WaitableEvent::WaitableEvent(&local_78);
  pbStack_90 = &local_99;
  pcStack_80 = std::
               _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:46030:7)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:46030:7)>
             ::_M_manager;
  local_98 = &local_78;
  (*this->_vptr_TracingSession[7])(this,&local_98,timeout_ms);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  base::WaitableEvent::Wait(&local_78);
  base::WaitableEvent::~WaitableEvent(&local_78);
  return (bool)(local_99 & 1);
}

Assistant:

bool TracingSession::FlushBlocking(uint32_t timeout_ms) {
  std::atomic<bool> flush_result;
  base::WaitableEvent flush_ack;

  // The non blocking Flush() can be called on any thread. It does the PostTask
  // internally.
  Flush(
      [&flush_ack, &flush_result](bool res) {
        flush_result = res;
        flush_ack.Notify();
      },
      timeout_ms);
  flush_ack.Wait();
  return flush_result;
}